

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::kill_expr
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens)

{
  bool bVar1;
  int iVar2;
  tree_type<cs::token_base_*> *tree_00;
  _Self *in_RSI;
  tree_type<cs::token_base_*> tree;
  token_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> expr;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> oldt;
  _Self *in_stack_fffffffffffffea8;
  _Self *in_stack_fffffffffffffeb0;
  token_expr *this_00;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar3;
  token_expr local_118;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffff00;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_e8;
  undefined1 *local_c8;
  undefined1 local_60 [80];
  _Self *local_10;
  
  local_10 = in_RSI;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1ae561);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1ae56e);
  std::swap<cs::token_base*,std::allocator<cs::token_base*>>
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffeb0
             ,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              in_stack_fffffffffffffea8);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  local_c8 = local_60;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffea8
            );
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffea8
            );
  do {
    bVar1 = std::operator!=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if (!bVar1) {
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                (in_stack_ffffffffffffff00);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                (in_stack_ffffffffffffff00);
      return;
    }
    local_118.super_token_base.line_num =
         (size_t)std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                 operator*(&local_e8);
    iVar2 = (*(*(token_base **)local_118.super_token_base.line_num)->_vptr_token_base[2])();
    if (iVar2 == 2) {
LAB_001ae617:
      bVar1 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::empty
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1ae624);
      if (!bVar1) {
        this_00 = &local_118;
        tree_type<cs::token_base_*>::tree_type((tree_type<cs::token_base_*> *)this_00);
        gen_tree((compiler_type *)
                 expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl
                 .super__Deque_impl_data._M_start._M_first,
                 (tree_type<cs::token_base_*> *)
                 expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl
                 .super__Deque_impl_data._M_start._M_cur,
                 (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl
                 .super__Deque_impl_data._M_map_size);
        in_stack_fffffffffffffeb0 = local_10;
        tree_00 = (tree_type<cs::token_base_*> *)token_base::operator_new((size_t)local_10);
        tree_type<cs::token_base_*>::tree_type
                  ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffeb0,
                   (tree_type<cs::token_base_*> *)in_stack_fffffffffffffea8);
        token_expr::token_expr(this_00,tree_00);
        uVar3 = 0;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8);
        tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x1ae6c3);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   CONCAT17(uVar3,in_stack_fffffffffffffed0));
        tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x1ae6da);
      }
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8);
    }
    else {
      iVar2 = (*(*(token_base **)local_118.super_token_base.line_num)->_vptr_token_base[2])();
      if (iVar2 == 1) goto LAB_001ae617;
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8);
    }
    std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++
              (in_stack_fffffffffffffeb0);
  } while( true );
}

Assistant:

void compiler_type::kill_expr(std::deque<token_base *> &tokens)
	{
		std::deque<token_base *> oldt, expr;
		std::swap(tokens, oldt);
		tokens.clear();
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::action || ptr->get_type() == token_types::endline) {
				if (!expr.empty()) {
					tree_type<token_base *> tree;
					gen_tree(tree, expr);
					tokens.push_back(new token_expr(tree));
					expr.clear();
				}
				tokens.push_back(ptr);
			}
			else
				expr.push_back(ptr);
		}
	}